

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void apply_imputation_results<PredictionData<float,unsigned_long>,ImputedData<unsigned_long,long_double>>
               (PredictionData<float,_unsigned_long> *prediction_data,
               ImputedData<unsigned_long,_long_double> *imp,Imputer *imputer,size_t row)

{
  longdouble lVar1;
  longdouble lVar2;
  bool bVar3;
  pointer puVar4;
  pointer plVar5;
  pointer plVar6;
  pointer pdVar7;
  float *pfVar8;
  size_t sVar9;
  ulong uVar10;
  pointer pvVar11;
  unsigned_long uVar12;
  int *piVar13;
  longdouble *plVar14;
  longdouble lVar15;
  int iVar16;
  size_t sVar17;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_> _Var18;
  long lVar19;
  ulong uVar20;
  size_t ix;
  long lVar21;
  bool bVar22;
  float fVar23;
  long local_68;
  ushort uStack_60;
  long local_58;
  ushort uStack_50;
  long local_48;
  ushort uStack_40;
  
  bVar3 = prediction_data->is_col_major;
  sVar17 = imp->n_missing_num;
  puVar4 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  plVar5 = (imp->num_sum).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar6 = (imp->num_weight).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar8 = prediction_data->numeric_data;
  if (bVar3 == false) {
    sVar9 = imputer->ncols_numeric;
    lVar21 = 0;
    lVar15 = (longdouble)0;
    while (bVar22 = sVar17 != 0, sVar17 = sVar17 - 1, bVar22) {
      lVar19 = *(long *)((long)puVar4 + lVar21);
      lVar1 = *(longdouble *)((long)plVar6 + lVar21 * 2);
      if (lVar1 <= lVar15) {
LAB_002e51c3:
        fVar23 = (float)pdVar7[lVar19];
      }
      else {
        lVar2 = *(longdouble *)((long)plVar5 + lVar21 * 2);
        uStack_40 = (ushort)((unkuint10)lVar2 >> 0x40);
        local_48 = SUB108(lVar2,0);
        if ((((unkuint10)lVar2 & 0x7fff) != 0 &&
             (0x7ffd < (ushort)((uStack_40 & 0x7fff) - 1) || -1 < local_48)) ||
           (((lVar2 == lVar15 && (!NAN(lVar2) && !NAN(lVar15))) && (NAN(pdVar7[lVar19])))))
        goto LAB_002e51c3;
        fVar23 = (float)(lVar2 / lVar1);
      }
      pfVar8[sVar9 * row + lVar19] = fVar23;
      lVar21 = lVar21 + 8;
    }
  }
  else {
    sVar9 = prediction_data->nrows;
    lVar21 = 0;
    lVar15 = (longdouble)0;
    while (bVar22 = sVar17 != 0, sVar17 = sVar17 - 1, bVar22) {
      lVar19 = *(long *)((long)puVar4 + lVar21);
      lVar1 = *(longdouble *)((long)plVar6 + lVar21 * 2);
      if (lVar1 <= lVar15) {
LAB_002e511b:
        fVar23 = (float)pdVar7[lVar19];
      }
      else {
        lVar2 = *(longdouble *)((long)plVar5 + lVar21 * 2);
        uStack_50 = (ushort)((unkuint10)lVar2 >> 0x40);
        local_58 = SUB108(lVar2,0);
        if ((((unkuint10)lVar2 & 0x7fff) != 0 &&
             (0x7ffd < (ushort)((uStack_50 & 0x7fff) - 1) || -1 < local_58)) ||
           (((lVar2 == lVar15 && (!NAN(lVar2) && !NAN(lVar15))) && (NAN(pdVar7[lVar19])))))
        goto LAB_002e511b;
        fVar23 = (float)(lVar2 / lVar1);
      }
      pfVar8[row + lVar19 * sVar9] = fVar23;
      lVar21 = lVar21 + 8;
    }
  }
  pfVar8 = prediction_data->Xr;
  if (pfVar8 != (float *)0x0) {
    uVar10 = prediction_data->Xr_indptr[row + 1];
    plVar5 = (imp->sp_num_sum).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl
             .super__Vector_impl_data._M_start;
    plVar6 = (imp->sp_num_weight).super__Vector_base<long_double,_std::allocator<long_double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar21 = 0;
    for (uVar20 = prediction_data->Xr_indptr[row]; uVar20 < uVar10; uVar20 = uVar20 + 1) {
      if (0x7f7fffff < (uint)ABS(pfVar8[uVar20])) {
        lVar15 = plVar6[lVar21];
        if (lVar15 <= (longdouble)0) {
LAB_002e52ae:
          fVar23 = (float)pdVar7[puVar4[lVar21]];
        }
        else {
          lVar1 = plVar5[lVar21];
          uStack_60 = (ushort)((unkuint10)lVar1 >> 0x40);
          local_68 = SUB108(lVar1,0);
          if (((unkuint10)lVar1 & 0x7fff) != 0 &&
              (0x7ffd < (ushort)((uStack_60 & 0x7fff) - 1) || -1 < local_68)) goto LAB_002e52ae;
          fVar23 = (float)(lVar1 / lVar15);
        }
        pfVar8[uVar20] = fVar23;
        lVar21 = lVar21 + 1;
      }
    }
  }
  if (bVar3 == false) {
    for (uVar20 = 0; uVar20 < imp->n_missing_cat; uVar20 = uVar20 + 1) {
      pvVar11 = (imp->cat_sum).
                super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar20];
      lVar21 = *(long *)&pvVar11[uVar12].
                         super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                         super__Vector_impl_data;
      _Var18 = std::
               __max_element<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (lVar21,*(pointer *)
                                  ((long)&pvVar11[uVar12].
                                          super__Vector_base<long_double,_std::allocator<long_double>_>
                                          ._M_impl.super__Vector_impl_data + 8));
      lVar19 = imputer->ncols_categ * row;
      piVar13 = prediction_data->categ_data;
      iVar16 = (int)((ulong)((long)_Var18._M_current - lVar21) >> 4);
      piVar13[uVar12 + lVar19] = iVar16;
      if (iVar16 == 0) {
        pvVar11 = (imp->cat_sum).
                  super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar16 = -1;
        if ((pvVar11 !=
             (imp->cat_sum).
             super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (plVar14 = pvVar11[uVar12].super__Vector_base<long_double,_std::allocator<long_double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
           plVar14 !=
           pvVar11[uVar12].super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_finish)) {
          if ((longdouble)0 < *plVar14) goto LAB_002e5403;
          iVar16 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
        }
        piVar13[uVar12 + lVar19] = iVar16;
      }
LAB_002e5403:
    }
  }
  else {
    for (uVar20 = 0; uVar20 < imp->n_missing_cat; uVar20 = uVar20 + 1) {
      pvVar11 = (imp->cat_sum).
                super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar20];
      lVar21 = *(long *)&pvVar11[uVar12].
                         super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                         super__Vector_impl_data;
      _Var18 = std::
               __max_element<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (lVar21,*(pointer *)
                                  ((long)&pvVar11[uVar12].
                                          super__Vector_base<long_double,_std::allocator<long_double>_>
                                          ._M_impl.super__Vector_impl_data + 8));
      lVar19 = prediction_data->nrows * uVar12;
      piVar13 = prediction_data->categ_data;
      iVar16 = (int)((ulong)((long)_Var18._M_current - lVar21) >> 4);
      piVar13[lVar19 + row] = iVar16;
      if (iVar16 == 0) {
        pvVar11 = (imp->cat_sum).
                  super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar16 = -1;
        if ((pvVar11 !=
             (imp->cat_sum).
             super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (plVar14 = pvVar11[uVar12].super__Vector_base<long_double,_std::allocator<long_double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
           plVar14 !=
           pvVar11[uVar12].super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_finish)) {
          if ((longdouble)0 < *plVar14) goto LAB_002e5371;
          iVar16 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
        }
        piVar13[lVar19 + row] = iVar16;
      }
LAB_002e5371:
    }
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}